

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_305e10::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader
          (JobEvalCacheMocT *this,SourceFileHandleT *headerHandle,string_view includerDir,
          string_view includeBase)

{
  void *pvVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  long lVar5;
  long lVar6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  anon_class_16_2_3be181d0 findHeader;
  anon_class_16_2_3be181d0 local_90;
  long local_80;
  long local_78;
  string local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  char *local_38;
  
  __it._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)includeBase._M_len;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&(this->super_JobEvalCacheT).SearchLocations,
                    (this->super_JobEvalCacheT).SearchLocations.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  views._M_len = 2;
  views._M_array = &local_50;
  local_90.this = this;
  local_90.headerHandle = headerHandle;
  local_50._M_len = includerDir._M_len;
  local_50._M_str = includerDir._M_str;
  local_40 = __it._M_current;
  local_38 = includeBase._M_str;
  cmCatViews_abi_cxx11_(&local_70,views);
  bVar3 = FindIncludedHeader::anon_class_16_2_3be181d0::operator()(&local_90,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    return true;
  }
  pvVar1 = ((this->super_JobEvalCacheT).super_JobT.super_JobT.Pool_)->UserData_;
  lVar6 = *(long *)((long)pvVar1 + 0x380);
  lVar2 = *(long *)((long)pvVar1 + 0x388);
  lVar5 = lVar2 - lVar6;
  if (0 < lVar5 >> 7) {
    lVar4 = (lVar5 >> 7) + 1;
    do {
      local_78 = lVar4;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                            *)&local_90,__it);
      lVar4 = lVar6;
      if (bVar3) goto LAB_001c908a;
      local_80 = lVar5;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                            *)&local_90,__it);
      lVar4 = lVar6 + 0x20;
      if (bVar3) goto LAB_001c908a;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                            *)&local_90,__it);
      lVar4 = lVar6 + 0x40;
      if (bVar3) goto LAB_001c908a;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                            *)&local_90,__it);
      lVar4 = lVar6 + 0x60;
      if (bVar3) goto LAB_001c908a;
      lVar6 = lVar6 + 0x80;
      lVar4 = local_78 + -1;
      lVar5 = local_80 + -0x80;
    } while (1 < lVar4);
  }
  lVar5 = lVar5 >> 5;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      lVar4 = lVar2;
      if ((lVar5 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::$_0>
                  ::operator()((_Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                                *)&local_90,__it), lVar4 = lVar6, bVar3)) goto LAB_001c908a;
      lVar6 = lVar6 + 0x20;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_90,__it);
    lVar4 = lVar6;
    if (bVar3) goto LAB_001c908a;
    lVar6 = lVar6 + 0x20;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::$_0>
          ::operator()((_Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                        *)&local_90,__it);
  lVar4 = lVar6;
  if (!bVar3) {
    lVar4 = lVar2;
  }
LAB_001c908a:
  return lVar4 != lVar2;
}

Assistant:

bool cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(
  SourceFileHandleT& headerHandle, cm::string_view includerDir,
  cm::string_view includeBase)
{
  // Clear search locations
  this->SearchLocations.clear();

  auto findHeader = [this,
                     &headerHandle](std::string const& basePath) -> bool {
    bool found = false;
    for (std::string const& ext : this->BaseConst().HeaderExtensions) {
      std::string const testPath =
        this->Gen()->CollapseFullPathTS(cmStrCat(basePath, '.', ext));
      cmFileTime fileTime;
      if (!fileTime.Load(testPath)) {
        // File not found
        continue;
      }

      // Return a known file if it exists already
      {
        auto it = this->BaseEval().Headers.find(testPath);
        if (it != this->BaseEval().Headers.end()) {
          headerHandle = it->second;
          found = true;
          break;
        }
      }

      // Created and return discovered file entry
      {
        SourceFileHandleT& handle =
          this->MocEval().HeadersDiscovered[testPath];
        if (!handle) {
          handle = std::make_shared<SourceFileT>(testPath);
          handle->FileTime = fileTime;
          handle->IsHeader = true;
          handle->Moc = true;
        }
        headerHandle = handle;
        found = true;
        break;
      }
    }
    if (!found) {
      this->SearchLocations.emplace_back(cmQtAutoGen::ParentDir(basePath));
    }
    return found;
  };

  // Search in vicinity of the source
  if (findHeader(cmStrCat(includerDir, includeBase))) {
    return true;
  }
  // Search in include directories
  auto const& includePaths = this->MocConst().IncludePaths;
  return std::any_of(
    includePaths.begin(), includePaths.end(),
    [&findHeader, &includeBase](std::string const& path) -> bool {
      return findHeader(cmStrCat(path, '/', includeBase));
    });
}